

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
     ::serialize<binlog::detail::VectorOutputStream>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
               VectorOutputStream *ostream)

{
  undefined4 uVar1;
  size_type sVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  uint32_t size32;
  size_type size;
  VectorOutputStream *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  sVar2 = sequence_size<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x119af8);
  uVar1 = (undefined4)sVar2;
  serialize<unsigned_int,binlog::detail::VectorOutputStream>
            ((uint *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  serialize_elems<binlog::detail::VectorOutputStream>(in_RDI,uVar1,in_RSI);
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }